

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

string * draco::ReplaceFileExtension(string *in_file_name,string *new_extension)

{
  ulong in_RSI;
  string *in_RDI;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  ulong local_10;
  
  local_10 = in_RSI;
  local_20 = std::__cxx11::string::find_last_of((char)in_RSI,0x2e);
  if (local_20 == -1) {
    pbVar1 = &local_40;
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::operator+(pbVar1,in_stack_ffffffffffffff70);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff90;
    std::__cxx11::string::substr((ulong)pbVar1,local_10);
    std::operator+(in_stack_ffffffffffffff78,pbVar1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  }
  return in_RDI;
}

Assistant:

std::string ReplaceFileExtension(const std::string &in_file_name,
                                 const std::string &new_extension) {
  const auto pos = in_file_name.find_last_of('.');
  if (pos == std::string::npos) {
    // No extension found.
    return in_file_name + "." + new_extension;
  }
  return in_file_name.substr(0, pos + 1) + new_extension;
}